

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

void __thiscall udpdiscovery::impl::MinimalisticThread::Join(MinimalisticThread *this)

{
  MinimalisticThread *this_local;
  
  if ((this->detached_ & 1U) == 0) {
    pthread_join(this->thread_,(void **)0x0);
    this->detached_ = true;
  }
  return;
}

Assistant:

void Join() {
    if (detached_) return;

#if defined(_WIN32)
    WaitForSingleObject(thread_, INFINITE);
    CloseHandle(thread_);
#else
    pthread_join(thread_, 0);
#endif
    detached_ = true;
  }